

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int ImGui::DataTypeFormatString
              (char *buf,int buf_size,ImGuiDataType data_type,void *p_data,char *format)

{
  char *format_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  int buf_size_local;
  char *buf_local;
  
  if ((data_type == 4) || (data_type == 5)) {
    buf_local._4_4_ = ImFormatString(buf,(long)buf_size,format,(ulong)*p_data);
  }
  else if ((data_type == 6) || (data_type == 7)) {
    buf_local._4_4_ = ImFormatString(buf,(long)buf_size,format,*p_data);
  }
  else if (data_type == 8) {
    buf_local._4_4_ = ImFormatString(buf,(long)buf_size,format,(double)*p_data);
  }
  else if (data_type == 9) {
    buf_local._4_4_ = ImFormatString(buf,(long)buf_size,format,*p_data);
  }
  else if (data_type == 0) {
    buf_local._4_4_ = ImFormatString(buf,(long)buf_size,format,(ulong)(uint)(int)*p_data);
  }
  else if (data_type == 1) {
    buf_local._4_4_ = ImFormatString(buf,(long)buf_size,format,(ulong)*p_data);
  }
  else if (data_type == 2) {
    buf_local._4_4_ = ImFormatString(buf,(long)buf_size,format,(ulong)(uint)(int)*p_data);
  }
  else {
    if (data_type != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_widgets.cpp"
                    ,0x6a6,
                    "int ImGui::DataTypeFormatString(char *, int, ImGuiDataType, const void *, const char *)"
                   );
    }
    buf_local._4_4_ = ImFormatString(buf,(long)buf_size,format,(ulong)*p_data);
  }
  return buf_local._4_4_;
}

Assistant:

int ImGui::DataTypeFormatString(char* buf, int buf_size, ImGuiDataType data_type, const void* p_data, const char* format)
{
    // Signedness doesn't matter when pushing integer arguments
    if (data_type == ImGuiDataType_S32 || data_type == ImGuiDataType_U32)
        return ImFormatString(buf, buf_size, format, *(const ImU32*)p_data);
    if (data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
        return ImFormatString(buf, buf_size, format, *(const ImU64*)p_data);
    if (data_type == ImGuiDataType_Float)
        return ImFormatString(buf, buf_size, format, *(const float*)p_data);
    if (data_type == ImGuiDataType_Double)
        return ImFormatString(buf, buf_size, format, *(const double*)p_data);
    if (data_type == ImGuiDataType_S8)
        return ImFormatString(buf, buf_size, format, *(const ImS8*)p_data);
    if (data_type == ImGuiDataType_U8)
        return ImFormatString(buf, buf_size, format, *(const ImU8*)p_data);
    if (data_type == ImGuiDataType_S16)
        return ImFormatString(buf, buf_size, format, *(const ImS16*)p_data);
    if (data_type == ImGuiDataType_U16)
        return ImFormatString(buf, buf_size, format, *(const ImU16*)p_data);
    IM_ASSERT(0);
    return 0;
}